

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConcurrentAssertionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ConcurrentAssertionStatementSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ConcurrentAssertionStatementSyntax *args_1)

{
  ConcurrentAssertionStatementSyntax *statement;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDX;
  ConcurrentAssertionMemberSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  statement = (ConcurrentAssertionStatementSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::ConcurrentAssertionMemberSyntax::ConcurrentAssertionMemberSyntax
            (in_RSI,in_RDX,statement);
  return (ConcurrentAssertionMemberSyntax *)statement;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }